

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int analysisLoader(void *pData,int argc,char **argv,char **NotUsed)

{
  long lVar1;
  int iVar2;
  Table *pTab;
  Index *aLog;
  char *pcVar3;
  Index *in_R8;
  long in_FS_OFFSET;
  Index fakeIdx;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((argv == (char **)0x0) || (*argv == (char *)0x0)) || (argv[2] == (char *)0x0))
  goto LAB_001535fd;
  pTab = sqlite3FindTable(*pData,*argv,*(char **)((long)pData + 8));
  if (pTab == (Table *)0x0) goto LAB_001535fd;
  pcVar3 = argv[1];
  if (pcVar3 == (char *)0x0) {
    pcVar3 = argv[2];
LAB_001535a9:
    fakeIdx._96_8_ = &DAT_aaaaaaaaaaaaaaaa;
    fakeIdx.colNotIdxed = (Bitmask)&DAT_aaaaaaaaaaaaaaaa;
    fakeIdx.aColExpr = (ExprList *)&DAT_aaaaaaaaaaaaaaaa;
    fakeIdx.azColl = (char **)&DAT_aaaaaaaaaaaaaaaa;
    fakeIdx.pPartIdxWhere = (Expr *)&DAT_aaaaaaaaaaaaaaaa;
    fakeIdx.pSchema = (Schema *)&DAT_aaaaaaaaaaaaaaaa;
    fakeIdx.aSortOrder = &DAT_aaaaaaaaaaaaaaaa;
    fakeIdx.zColAff = &DAT_aaaaaaaaaaaaaaaa;
    fakeIdx.pNext = (Index *)&DAT_aaaaaaaaaaaaaaaa;
    fakeIdx.aiRowLogEst = (LogEst *)&DAT_aaaaaaaaaaaaaaaa;
    fakeIdx.pTable = (Table *)&DAT_aaaaaaaaaaaaaaaa;
    fakeIdx.zName = &DAT_aaaaaaaaaaaaaaaa;
    fakeIdx.aiColumn = (i16 *)&DAT_aaaaaaaaaaaaaaaa;
    fakeIdx.szIdxRow = pTab->szTabRow;
    fakeIdx.tnum = 0xaaaaaaaa;
    fakeIdx.nKeyCol = 0xaaaa;
    decodeIntArray(pcVar3,1,(tRowcnt *)&pTab->nRowLogEst,(LogEst *)&fakeIdx,in_R8);
    pTab->szTabRow = fakeIdx.szIdxRow;
  }
  else {
    iVar2 = sqlite3_stricmp(*argv,pcVar3);
    if (iVar2 == 0) {
      aLog = sqlite3PrimaryKeyIndex(pTab);
    }
    else {
      aLog = sqlite3FindIndex(*pData,pcVar3,*(char **)((long)pData + 8));
    }
    pcVar3 = argv[2];
    if (aLog == (Index *)0x0) goto LAB_001535a9;
    aLog->field_0x63 = aLog->field_0x63 & 0xfb;
    decodeIntArray(pcVar3,aLog->nKeyCol + 1,(tRowcnt *)aLog->aiRowLogEst,(LogEst *)aLog,in_R8);
    aLog->field_0x63 = aLog->field_0x63 | 0x80;
    if (aLog->pPartIdxWhere != (Expr *)0x0) goto LAB_001535fd;
    pTab->nRowLogEst = *aLog->aiRowLogEst;
  }
  *(byte *)&pTab->tabFlags = (byte)pTab->tabFlags | 0x10;
LAB_001535fd:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

static int analysisLoader(void *pData, int argc, char **argv, char **NotUsed){
  analysisInfo *pInfo = (analysisInfo*)pData;
  Index *pIndex;
  Table *pTable;
  const char *z;

  assert( argc==3 );
  UNUSED_PARAMETER2(NotUsed, argc);

  if( argv==0 || argv[0]==0 || argv[2]==0 ){
    return 0;
  }
  pTable = sqlite3FindTable(pInfo->db, argv[0], pInfo->zDatabase);
  if( pTable==0 ){
    return 0;
  }
  if( argv[1]==0 ){
    pIndex = 0;
  }else if( sqlite3_stricmp(argv[0],argv[1])==0 ){
    pIndex = sqlite3PrimaryKeyIndex(pTable);
  }else{
    pIndex = sqlite3FindIndex(pInfo->db, argv[1], pInfo->zDatabase);
  }
  z = argv[2];

  if( pIndex ){
    tRowcnt *aiRowEst = 0;
    int nCol = pIndex->nKeyCol+1;
#ifdef SQLITE_ENABLE_STAT4
    /* Index.aiRowEst may already be set here if there are duplicate
    ** sqlite_stat1 entries for this index. In that case just clobber
    ** the old data with the new instead of allocating a new array.  */
    if( pIndex->aiRowEst==0 ){
      pIndex->aiRowEst = (tRowcnt*)sqlite3MallocZero(sizeof(tRowcnt) * nCol);
      if( pIndex->aiRowEst==0 ) sqlite3OomFault(pInfo->db);
    }
    aiRowEst = pIndex->aiRowEst;
#endif
    pIndex->bUnordered = 0;
    decodeIntArray((char*)z, nCol, aiRowEst, pIndex->aiRowLogEst, pIndex);
    pIndex->hasStat1 = 1;
    if( pIndex->pPartIdxWhere==0 ){
      pTable->nRowLogEst = pIndex->aiRowLogEst[0];
      pTable->tabFlags |= TF_HasStat1;
    }
  }else{
    Index fakeIdx;
    fakeIdx.szIdxRow = pTable->szTabRow;
#ifdef SQLITE_ENABLE_COSTMULT
    fakeIdx.pTable = pTable;
#endif
    decodeIntArray((char*)z, 1, 0, &pTable->nRowLogEst, &fakeIdx);
    pTable->szTabRow = fakeIdx.szIdxRow;
    pTable->tabFlags |= TF_HasStat1;
  }

  return 0;
}